

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u16 uVar1;
  u8 *local_70;
  u8 *pSlot;
  int rc;
  int sz;
  u8 *pEnd;
  int k;
  int iEnd;
  u8 *pData;
  u8 *aData;
  int local_38;
  int i;
  int nCell_local;
  int iFirst_local;
  u8 *pCellptr_local;
  u8 **ppData_local;
  u8 *pBegin_local;
  MemPage *pPg_local;
  
  pData = pPg->aData;
  _k = *ppData;
  pEnd._4_4_ = iFirst + nCell;
  if (iFirst < pEnd._4_4_) {
    for (pEnd._0_4_ = 0; pCArray->ixNx[(int)pEnd] <= iFirst && (int)pEnd < 6;
        pEnd._0_4_ = (int)pEnd + 1) {
    }
    _rc = pCArray->apEnd[(int)pEnd];
    aData._4_4_ = iFirst;
    local_38 = nCell;
    i = iFirst;
    _nCell_local = pCellptr;
    pCellptr_local = (u8 *)ppData;
    ppData_local = (u8 **)pBegin;
    pBegin_local = &pPg->isInit;
    while( true ) {
      uVar1 = cachedCellSize(pCArray,aData._4_4_);
      pSlot._4_4_ = (uint)uVar1;
      if (((pData[1] == '\0') && (pData[2] == '\0')) ||
         (local_70 = pageFindSlot((MemPage *)pBegin_local,pSlot._4_4_,(int *)&pSlot),
         local_70 == (u8 *)0x0)) {
        if ((long)_k - (long)ppData_local < (long)(int)pSlot._4_4_) {
          return 1;
        }
        local_70 = _k + -(long)(int)pSlot._4_4_;
        _k = local_70;
      }
      if ((_rc < pCArray->apCell[aData._4_4_] + (int)pSlot._4_4_) &&
         (pCArray->apCell[aData._4_4_] < _rc)) {
        sqlite3CorruptError(0x11279);
        return 1;
      }
      memmove(local_70,pCArray->apCell[aData._4_4_],(long)(int)pSlot._4_4_);
      *_nCell_local = (u8)((ulong)((long)local_70 - (long)pData) >> 8);
      _nCell_local[1] = (char)local_70 - (char)pData;
      _nCell_local = _nCell_local + 2;
      aData._4_4_ = aData._4_4_ + 1;
      if (pEnd._4_4_ <= aData._4_4_) break;
      if (pCArray->ixNx[(int)pEnd] <= aData._4_4_) {
        pEnd._0_4_ = (int)pEnd + 1;
        _rc = pCArray->apEnd[(int)pEnd];
      }
    }
    *(u8 **)pCellptr_local = _k;
  }
  return 0;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content-area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i = iFirst;                 /* Loop counter - cell index to insert */
  u8 *aData = pPg->aData;         /* Complete page */
  u8 *pData = *ppData;            /* Content area.  A subset of aData[] */
  int iEnd = iFirst + nCell;      /* End of loop. One past last cell to ins */
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pEnd;                       /* Maximum extent of cell data */
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  if( iEnd<=iFirst ) return 0;
  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pEnd = pCArray->apEnd[k];
  while( 1 /*Exit by break*/ ){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    if( (uptr)(pCArray->apCell[i]+sz)>(uptr)pEnd
     && (uptr)(pCArray->apCell[i])<(uptr)pEnd
    ){
      assert( CORRUPT_DB );
      (void)SQLITE_CORRUPT_BKPT;
      return 1;
    }
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pEnd = pCArray->apEnd[k];
    }
  }
  *ppData = pData;
  return 0;
}